

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O1

FileDescriptor * __thiscall
google::protobuf::DescriptorBuilder::BuildFile(DescriptorBuilder *this,FileDescriptorProto *proto)

{
  RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *this_00;
  pointer pbVar1;
  string *psVar2;
  size_t sVar3;
  size_t __n;
  Tables *pTVar4;
  DescriptorPool *pDVar5;
  pointer pcVar6;
  FileDescriptorTables *pFVar7;
  atomic<unsigned_long> this_01;
  int iVar8;
  const_iterator cVar9;
  char *value;
  Type *pTVar10;
  FileDescriptor *pFVar11;
  FileDescriptorProto *proto_00;
  size_type *psVar12;
  long lVar13;
  long lVar14;
  bool bVar15;
  undefined1 local_158 [8];
  FileDescriptorProto existing_proto;
  size_t local_78;
  undefined1 local_70 [24];
  size_t local_58;
  __atomic_base<unsigned_long> local_40;
  FileDescriptorProto *local_38;
  
  local_38 = proto;
  std::__cxx11::string::_M_assign((string *)&this->filename_);
  local_158 = (undefined1  [8])(this->filename_)._M_dataplus._M_p;
  cVar9 = std::
          _Hashtable<const_char_*,_std::pair<const_char_*const,_const_google::protobuf::FileDescriptor_*>,_std::allocator<std::pair<const_char_*const,_const_google::protobuf::FileDescriptor_*>_>,_std::__detail::_Select1st,_google::protobuf::streq,_google::protobuf::hash<const_char_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
          ::find(&(this->tables_->files_by_name_)._M_h,(key_type *)local_158);
  if (cVar9.
      super__Node_iterator_base<std::pair<const_char_*const,_const_google::protobuf::FileDescriptor_*>,_true>
      ._M_cur == (__node_type *)0x0) {
    pFVar11 = (FileDescriptor *)0x0;
  }
  else {
    pFVar11 = *(FileDescriptor **)
               ((long)cVar9.
                      super__Node_iterator_base<std::pair<const_char_*const,_const_google::protobuf::FileDescriptor_*>,_true>
                      ._M_cur + 0x10);
  }
  if (pFVar11 != (FileDescriptor *)0x0) {
    FileDescriptorProto::FileDescriptorProto((FileDescriptorProto *)local_158,(Arena *)0x0);
    FileDescriptor::CopyTo(pFVar11,(FileDescriptorProto *)local_158);
    if ((*(int *)(pFVar11 + 0x3c) == 2) && (((local_38->_has_bits_).has_bits_[0] & 4) != 0)) {
      value = FileDescriptor::SyntaxName(SYNTAX_PROTO2);
      FileDescriptorProto::set_syntax((FileDescriptorProto *)local_158,value);
    }
    MessageLite::SerializeAsString_abi_cxx11_((string *)(local_70 + 0x10),(MessageLite *)local_158);
    MessageLite::SerializeAsString_abi_cxx11_
              ((string *)&existing_proto.source_code_info_,(MessageLite *)local_38);
    if (local_58 == local_78) {
      if (local_58 == 0) {
        bVar15 = true;
      }
      else {
        iVar8 = bcmp((void *)local_70._16_8_,existing_proto.source_code_info_,local_58);
        bVar15 = iVar8 == 0;
      }
    }
    else {
      bVar15 = false;
    }
    if (existing_proto.source_code_info_ != (SourceCodeInfo *)local_70) {
      operator_delete(existing_proto.source_code_info_);
    }
    if ((Arena *)local_70._16_8_ != (Arena *)&stack0xffffffffffffffb0) {
      operator_delete((void *)local_70._16_8_);
    }
    FileDescriptorProto::~FileDescriptorProto((FileDescriptorProto *)local_158);
    if (bVar15) {
      return pFVar11;
    }
  }
  pbVar1 = (this->tables_->pending_files_).
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  lVar13 = (long)(this->tables_->pending_files_).
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish - (long)pbVar1;
  local_40._M_i = (__int_type_conflict)this;
  if (lVar13 != 0) {
    lVar13 = lVar13 >> 5;
    psVar2 = (local_38->name_).ptr_;
    sVar3 = psVar2->_M_string_length;
    psVar12 = &pbVar1->_M_string_length;
    lVar14 = 0;
    do {
      __n = *psVar12;
      if ((__n == sVar3) &&
         ((__n == 0 ||
          (iVar8 = bcmp((((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         (psVar12 + -1))->_M_dataplus)._M_p,(psVar2->_M_dataplus)._M_p,__n),
          iVar8 == 0)))) {
        AddRecursiveImportError((DescriptorBuilder *)local_40._M_i,local_38,(int)lVar14);
        return (FileDescriptor *)0x0;
      }
      lVar14 = lVar14 + 1;
      psVar12 = psVar12 + 4;
    } while (lVar13 + (ulong)(lVar13 == 0) != lVar14);
  }
  proto_00 = local_38;
  this_01.super___atomic_base<unsigned_long>._M_i =
       (__atomic_base<unsigned_long>)(__atomic_base<unsigned_long>)local_40._M_i;
  if ((*(char *)(*(long *)local_40._M_i + 0x29) == '\0') &&
     (*(long *)(*(long *)local_40._M_i + 8) != 0)) {
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back(&(*(Tables **)(local_40._M_i + 8))->pending_files_,(local_38->name_).ptr_);
    if (0 < (proto_00->dependency_).super_RepeatedPtrFieldBase.current_size_) {
      this_00 = &proto_00->dependency_;
      iVar8 = 0;
      do {
        pTVar4 = *(Tables **)((long)this_01.super___atomic_base<unsigned_long>._M_i + 8);
        pTVar10 = internal::RepeatedPtrFieldBase::
                  Get<google::protobuf::RepeatedPtrField<std::__cxx11::string>::TypeHandler>
                            (&this_00->super_RepeatedPtrFieldBase,iVar8);
        local_158 = (undefined1  [8])(pTVar10->_M_dataplus)._M_p;
        cVar9 = std::
                _Hashtable<const_char_*,_std::pair<const_char_*const,_const_google::protobuf::FileDescriptor_*>,_std::allocator<std::pair<const_char_*const,_const_google::protobuf::FileDescriptor_*>_>,_std::__detail::_Select1st,_google::protobuf::streq,_google::protobuf::hash<const_char_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                ::find(&(pTVar4->files_by_name_)._M_h,(key_type *)local_158);
        if ((cVar9.
             super__Node_iterator_base<std::pair<const_char_*const,_const_google::protobuf::FileDescriptor_*>,_true>
             ._M_cur == (__node_type *)0x0) ||
           (*(long *)((long)cVar9.
                            super__Node_iterator_base<std::pair<const_char_*const,_const_google::protobuf::FileDescriptor_*>,_true>
                            ._M_cur + 0x10) == 0)) {
          pDVar5 = *(DescriptorPool **)
                    (*(long *)this_01.super___atomic_base<unsigned_long>._M_i + 0x18);
          if (pDVar5 != (DescriptorPool *)0x0) {
            pTVar10 = internal::RepeatedPtrFieldBase::
                      Get<google::protobuf::RepeatedPtrField<std::__cxx11::string>::TypeHandler>
                                (&this_00->super_RepeatedPtrFieldBase,iVar8);
            pFVar11 = DescriptorPool::FindFileByName(pDVar5,pTVar10);
            if (pFVar11 != (FileDescriptor *)0x0) goto LAB_0027726c;
          }
          pDVar5 = *(DescriptorPool **)this_01.super___atomic_base<unsigned_long>._M_i;
          pTVar10 = internal::RepeatedPtrFieldBase::
                    Get<google::protobuf::RepeatedPtrField<std::__cxx11::string>::TypeHandler>
                              (&this_00->super_RepeatedPtrFieldBase,iVar8);
          DescriptorPool::TryFindFileInFallbackDatabase(pDVar5,pTVar10);
        }
LAB_0027726c:
        iVar8 = iVar8 + 1;
      } while (iVar8 < (proto_00->dependency_).super_RepeatedPtrFieldBase.current_size_);
    }
    pbVar1 = ((*(Tables **)((long)this_01.super___atomic_base<unsigned_long>._M_i + 8))->
             pending_files_).
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    ((*(Tables **)((long)this_01.super___atomic_base<unsigned_long>._M_i + 8))->pending_files_).
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = pbVar1 + -1;
    pcVar6 = pbVar1[-1]._M_dataplus._M_p;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)pcVar6 != &pbVar1[-1].field_2) {
      operator_delete(pcVar6);
    }
  }
  DescriptorPool::Tables::AddCheckpoint
            (*(Tables **)((long)this_01.super___atomic_base<unsigned_long>._M_i + 8));
  pFVar11 = BuildFileImpl((DescriptorBuilder *)this_01.super___atomic_base<unsigned_long>._M_i,
                          proto_00);
  pFVar7 = *(FileDescriptorTables **)((long)this_01.super___atomic_base<unsigned_long>._M_i + 0x60);
  std::
  unique_ptr<std::unordered_map<std::pair<const_void_*,_const_char_*>,_const_google::protobuf::FieldDescriptor_*,_google::protobuf::(anonymous_namespace)::PointerStringPairHash,_google::protobuf::(anonymous_namespace)::PointerStringPairEqual,_std::allocator<std::pair<const_std::pair<const_void_*,_const_char_*>,_const_google::protobuf::FieldDescriptor_*>_>_>,_std::default_delete<std::unordered_map<std::pair<const_void_*,_const_char_*>,_const_google::protobuf::FieldDescriptor_*,_google::protobuf::(anonymous_namespace)::PointerStringPairHash,_google::protobuf::(anonymous_namespace)::PointerStringPairEqual,_std::allocator<std::pair<const_std::pair<const_void_*,_const_char_*>,_const_google::protobuf::FieldDescriptor_*>_>_>_>_>
  ::operator=(&pFVar7->fields_by_lowercase_name_tmp_,proto_00);
  std::
  unique_ptr<std::unordered_map<std::pair<const_void_*,_const_char_*>,_const_google::protobuf::FieldDescriptor_*,_google::protobuf::(anonymous_namespace)::PointerStringPairHash,_google::protobuf::(anonymous_namespace)::PointerStringPairEqual,_std::allocator<std::pair<const_std::pair<const_void_*,_const_char_*>,_const_google::protobuf::FieldDescriptor_*>_>_>,_std::default_delete<std::unordered_map<std::pair<const_void_*,_const_char_*>,_const_google::protobuf::FieldDescriptor_*,_google::protobuf::(anonymous_namespace)::PointerStringPairHash,_google::protobuf::(anonymous_namespace)::PointerStringPairEqual,_std::allocator<std::pair<const_std::pair<const_void_*,_const_char_*>,_const_google::protobuf::FieldDescriptor_*>_>_>_>_>
  ::operator=(&pFVar7->fields_by_camelcase_name_tmp_,proto_00);
  if (pFVar11 == (FileDescriptor *)0x0) {
    DescriptorPool::Tables::RollbackToLastCheckpoint
              (*(Tables **)((long)this_01.super___atomic_base<unsigned_long>._M_i + 8));
  }
  else {
    DescriptorPool::Tables::ClearLastCheckpoint
              (*(Tables **)((long)this_01.super___atomic_base<unsigned_long>._M_i + 8));
    pFVar11[0x41] = (FileDescriptor)0x1;
  }
  return pFVar11;
}

Assistant:

const FileDescriptor* DescriptorBuilder::BuildFile(
    const FileDescriptorProto& proto) {
  filename_ = proto.name();

  // Check if the file already exists and is identical to the one being built.
  // Note:  This only works if the input is canonical -- that is, it
  //   fully-qualifies all type names, has no UninterpretedOptions, etc.
  //   This is fine, because this idempotency "feature" really only exists to
  //   accommodate one hack in the proto1->proto2 migration layer.
  const FileDescriptor* existing_file = tables_->FindFile(filename_);
  if (existing_file != nullptr) {
    // File already in pool.  Compare the existing one to the input.
    if (ExistingFileMatchesProto(existing_file, proto)) {
      // They're identical.  Return the existing descriptor.
      return existing_file;
    }

    // Not a match.  The error will be detected and handled later.
  }

  // Check to see if this file is already on the pending files list.
  // TODO(kenton):  Allow recursive imports?  It may not work with some
  //   (most?) programming languages.  E.g., in C++, a forward declaration
  //   of a type is not sufficient to allow it to be used even in a
  //   generated header file due to inlining.  This could perhaps be
  //   worked around using tricks involving inserting #include statements
  //   mid-file, but that's pretty ugly, and I'm pretty sure there are
  //   some languages out there that do not allow recursive dependencies
  //   at all.
  for (int i = 0; i < tables_->pending_files_.size(); i++) {
    if (tables_->pending_files_[i] == proto.name()) {
      AddRecursiveImportError(proto, i);
      return nullptr;
    }
  }

  // If we have a fallback_database_, and we aren't doing lazy import building,
  // attempt to load all dependencies now, before checkpointing tables_.  This
  // avoids confusion with recursive checkpoints.
  if (!pool_->lazily_build_dependencies_) {
    if (pool_->fallback_database_ != nullptr) {
      tables_->pending_files_.push_back(proto.name());
      for (int i = 0; i < proto.dependency_size(); i++) {
        if (tables_->FindFile(proto.dependency(i)) == nullptr &&
            (pool_->underlay_ == nullptr ||
             pool_->underlay_->FindFileByName(proto.dependency(i)) ==
                 nullptr)) {
          // We don't care what this returns since we'll find out below anyway.
          pool_->TryFindFileInFallbackDatabase(proto.dependency(i));
        }
      }
      tables_->pending_files_.pop_back();
    }
  }

  // Checkpoint the tables so that we can roll back if something goes wrong.
  tables_->AddCheckpoint();

  FileDescriptor* result = BuildFileImpl(proto);

  file_tables_->FinalizeTables();
  if (result) {
    tables_->ClearLastCheckpoint();
    result->finished_building_ = true;
  } else {
    tables_->RollbackToLastCheckpoint();
  }

  return result;
}